

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::UpdateSBT
          (DeviceContextVkImpl *this,IShaderBindingTable *pSBT,
          UpdateIndirectRTBufferAttribs *pUpdateIndirectBufferAttribs)

{
  DeviceContextVkImpl *this_00;
  bool bVar1;
  undefined4 extraout_EAX;
  int iVar2;
  undefined1 auVar3 [16];
  BufferVkImpl *pSBTBufferVk;
  string msg;
  BufferVkImpl *local_d8;
  DeviceContextVkImpl *local_d0;
  BindingTable local_c8;
  BindingTable local_a8;
  BindingTable local_88;
  BindingTable local_68;
  string local_50;
  
  local_d0 = this;
  DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateSBT
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pSBT,
             pUpdateIndirectBufferAttribs,0);
  if (pSBT != (IShaderBindingTable *)0x0) {
    CheckDynamicType<Diligent::ShaderBindingTableVkImpl,Diligent::IShaderBindingTable>(pSBT);
  }
  local_d8 = (BufferVkImpl *)0x0;
  local_68.Stride = 0;
  local_68.pData = (void *)0x0;
  local_68.Size = 0;
  local_68.Offset = 0;
  local_88.Stride = 0;
  local_88.pData = (void *)0x0;
  local_88.Size = 0;
  local_88.Offset = 0;
  local_a8.Stride = 0;
  local_a8.pData = (void *)0x0;
  local_a8.Size = 0;
  local_a8.Offset = 0;
  local_c8.Stride = 0;
  local_c8.pData = (void *)0x0;
  local_c8.Size = 0;
  local_c8.Offset = 0;
  ShaderBindingTableVkImpl::GetData
            ((ShaderBindingTableVkImpl *)pSBT,&local_d8,&local_68,&local_88,&local_a8,&local_c8);
  this_00 = local_d0;
  auVar3._0_4_ = -(uint)((int)local_68.pData == 0 && (int)local_a8.pData == 0);
  auVar3._4_4_ = -(uint)(local_68.pData._4_4_ == 0 && local_a8.pData._4_4_ == 0);
  auVar3._8_4_ = -(uint)(local_88.Size == 0 && local_c8.Size == 0);
  auVar3._12_4_ = -(uint)(local_88.Offset == 0 && local_c8.Offset == 0);
  iVar2 = movmskps(extraout_EAX,auVar3);
  if (iVar2 == 0xf) {
    bVar1 = BufferBase<Diligent::EngineVkImplTraits>::CheckState
                      (&local_d8->super_BufferBase<Diligent::EngineVkImplTraits>,
                       RESOURCE_STATE_RAY_TRACING);
    if (!bVar1) {
      FormatString<char[62]>
                (&local_50,
                 (char (*) [62])"SBT buffer must always be in RESOURCE_STATE_RAY_TRACING state");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"UpdateSBT",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xf7d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    TransitionOrVerifyBufferState
              (local_d0,local_d8,RESOURCE_STATE_TRANSITION_MODE_TRANSITION,RESOURCE_STATE_COPY_DEST,
               VK_ACCESS_TRANSFER_WRITE_BIT,
               "Update shader binding table (DeviceContextVkImpl::UpdateSBT)");
    if (local_68.pData != (void *)0x0) {
      UpdateBuffer(this_00,(IBuffer *)local_d8,(ulong)local_68._8_8_ >> 0x20,
                   local_68._8_8_ & 0xffffffff,local_68.pData,RESOURCE_STATE_TRANSITION_MODE_VERIFY)
      ;
    }
    if (local_88.pData != (void *)0x0) {
      UpdateBuffer(this_00,(IBuffer *)local_d8,(ulong)local_88._8_8_ >> 0x20,
                   local_88._8_8_ & 0xffffffff,local_88.pData,RESOURCE_STATE_TRANSITION_MODE_VERIFY)
      ;
    }
    if (local_a8.pData != (void *)0x0) {
      UpdateBuffer(this_00,(IBuffer *)local_d8,(ulong)local_a8._8_8_ >> 0x20,
                   local_a8._8_8_ & 0xffffffff,local_a8.pData,RESOURCE_STATE_TRANSITION_MODE_VERIFY)
      ;
    }
    if (local_c8.pData != (void *)0x0) {
      UpdateBuffer(this_00,(IBuffer *)local_d8,(ulong)local_c8._8_8_ >> 0x20,
                   local_c8._8_8_ & 0xffffffff,local_c8.pData,RESOURCE_STATE_TRANSITION_MODE_VERIFY)
      ;
    }
    TransitionOrVerifyBufferState
              (this_00,local_d8,RESOURCE_STATE_TRANSITION_MODE_TRANSITION,RESOURCE_STATE_RAY_TRACING
               ,VK_ACCESS_SHADER_READ_BIT,
               "Update shader binding table (DeviceContextVkImpl::UpdateSBT)");
  }
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateSBT(IShaderBindingTable* pSBT, const UpdateIndirectRTBufferAttribs* pUpdateIndirectBufferAttribs)
{
    TDeviceContextBase::UpdateSBT(pSBT, pUpdateIndirectBufferAttribs, 0);

    ShaderBindingTableVkImpl* pSBTVk       = ClassPtrCast<ShaderBindingTableVkImpl>(pSBT);
    BufferVkImpl*             pSBTBufferVk = nullptr;

    ShaderBindingTableVkImpl::BindingTable RayGenShaderRecord  = {};
    ShaderBindingTableVkImpl::BindingTable MissShaderTable     = {};
    ShaderBindingTableVkImpl::BindingTable HitGroupTable       = {};
    ShaderBindingTableVkImpl::BindingTable CallableShaderTable = {};

    pSBTVk->GetData(pSBTBufferVk, RayGenShaderRecord, MissShaderTable, HitGroupTable, CallableShaderTable);

    const char* OpName = "Update shader binding table (DeviceContextVkImpl::UpdateSBT)";

    if (RayGenShaderRecord.pData || MissShaderTable.pData || HitGroupTable.pData || CallableShaderTable.pData)
    {
        TransitionOrVerifyBufferState(*pSBTBufferVk, RESOURCE_STATE_TRANSITION_MODE_TRANSITION, RESOURCE_STATE_COPY_DEST, VK_ACCESS_TRANSFER_WRITE_BIT, OpName);

        // Buffer ranges do not intersect, so we don't need to add barriers between them
        if (RayGenShaderRecord.pData)
            UpdateBuffer(pSBTBufferVk, RayGenShaderRecord.Offset, RayGenShaderRecord.Size, RayGenShaderRecord.pData, RESOURCE_STATE_TRANSITION_MODE_VERIFY);

        if (MissShaderTable.pData)
            UpdateBuffer(pSBTBufferVk, MissShaderTable.Offset, MissShaderTable.Size, MissShaderTable.pData, RESOURCE_STATE_TRANSITION_MODE_VERIFY);

        if (HitGroupTable.pData)
            UpdateBuffer(pSBTBufferVk, HitGroupTable.Offset, HitGroupTable.Size, HitGroupTable.pData, RESOURCE_STATE_TRANSITION_MODE_VERIFY);

        if (CallableShaderTable.pData)
            UpdateBuffer(pSBTBufferVk, CallableShaderTable.Offset, CallableShaderTable.Size, CallableShaderTable.pData, RESOURCE_STATE_TRANSITION_MODE_VERIFY);

        TransitionOrVerifyBufferState(*pSBTBufferVk, RESOURCE_STATE_TRANSITION_MODE_TRANSITION, RESOURCE_STATE_RAY_TRACING, VK_ACCESS_SHADER_READ_BIT, OpName);
    }
    else
    {
        // Ray tracing command can be used in parallel with the same SBT, so internal buffer state must be RESOURCE_STATE_RAY_TRACING to allow it.
        VERIFY(pSBTBufferVk->CheckState(RESOURCE_STATE_RAY_TRACING), "SBT buffer must always be in RESOURCE_STATE_RAY_TRACING state");
    }
}